

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O0

double __thiscall
TasGrid::GridLocalPolynomial::evalBasisSupported<(TasGrid::RuleLocal::erule)1>
          (GridLocalPolynomial *this,int *point,double *x,bool *isSupported)

{
  double dVar1;
  int local_3c;
  GridLocalPolynomial *pGStack_38;
  int j;
  double f;
  bool *isSupported_local;
  double *x_local;
  int *point_local;
  GridLocalPolynomial *this_local;
  
  pGStack_38 = (GridLocalPolynomial *)
               RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>
                         (this->order,*point,*x,isSupported);
  if ((*isSupported & 1U) == 0) {
    this_local = (GridLocalPolynomial *)0x0;
  }
  else {
    for (local_3c = 1; local_3c < (this->super_BaseCanonicalGrid).num_dimensions;
        local_3c = local_3c + 1) {
      dVar1 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>
                        (this->order,point[local_3c],x[local_3c],isSupported);
      pGStack_38 = (GridLocalPolynomial *)(dVar1 * (double)pGStack_38);
      if ((*isSupported & 1U) == 0) {
        return 0.0;
      }
    }
    this_local = pGStack_38;
  }
  return (double)this_local;
}

Assistant:

double evalBasisSupported(const int point[], const double x[], bool &isSupported) const{
        double f = RuleLocal::evalSupport<eff_rule>(order, point[0], x[0], isSupported);
        if (!isSupported) return 0.0;
        for(int j=1; j<num_dimensions; j++){
            f *= RuleLocal::evalSupport<eff_rule>(order, point[j], x[j], isSupported);
            if (!isSupported) return 0.0;
        }
        return f;
    }